

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  allocator<char> local_31;
  string local_30;
  undefined4 local_c;
  
  local_c = 0;
  this = std::operator<<((ostream *)&std::cout,"---------------");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"nfa0",&local_31);
  create_dfa(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return 0;
}

Assistant:

int main() {
    cout << "---------------" << endl;
    create_dfa("nfa0");

    /*
    create_dfa("nfa1");
    create_dfa("nfa2");
    create_dfa("nfa3");
    create_dfa("nfa4");
    */
    return 0;
}